

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphAdjacencyList.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<cmGraphEdge*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (cmGraphEdge *__result,cmGraphEdge *__a,cmGraphEdge *__b,cmGraphEdge *__c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  cmGraphEdge *__b_00;
  
  iVar1 = __a->Dest;
  iVar2 = __b->Dest;
  iVar3 = __c->Dest;
  if (iVar1 < iVar2) {
    __b_00 = __b;
    if ((iVar3 <= iVar2) && (__b_00 = __a, iVar1 < iVar3)) {
      __b_00 = __c;
    }
  }
  else {
    __b_00 = __a;
    if ((iVar3 <= iVar1) && (__b_00 = __b, iVar2 < iVar3)) {
      __b_00 = __c;
    }
  }
  swap<cmGraphEdge>(__result,__b_00);
  return;
}

Assistant:

operator int() const { return this->Dest; }